

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

Slice __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::value
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  bool bVar1;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffffd8;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  bVar1 = isTagged((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11d648);
  if (bVar1) {
    valueStart(in_stack_ffffffffffffffe0);
    local_8 = make(in_stack_ffffffffffffffd8,(uint8_t *)0x11d665);
  }
  else {
    ptr((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11d682);
    local_8 = make(in_stack_ffffffffffffffd8,(uint8_t *)0x11d68f);
  }
  return (Slice)local_8;
}

Assistant:

constexpr SliceType const value() const noexcept {
    return isTagged() ? make(valueStart()) : make(ptr());
  }